

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  __node_base type;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Types TVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  Variant *this_00;
  size_t sVar9;
  CompilerError *pCVar10;
  char *pcVar11;
  TypedID *pTVar12;
  SPIRVariable *var_00;
  bool bVar13;
  SPIRFunction *local_ab8;
  undefined1 local_9c8 [32];
  undefined1 local_9a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968 [32];
  uint local_948;
  uint local_944;
  uint32_t i_6;
  uint32_t array_size_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [38];
  char local_8fa;
  allocator local_8f9;
  string local_8f8 [32];
  undefined1 local_8d8 [44];
  AccessChainMeta meta_6;
  uint32_t indices_6 [2];
  uint32_t i_5;
  uint32_t num_control_points_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [38];
  char local_852;
  allocator local_851;
  string local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0 [36];
  uint local_7ac;
  string local_7a8 [4];
  uint32_t i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [32];
  undefined1 local_768 [40];
  AccessChainMeta meta_5;
  uint32_t indices_5 [2];
  uint32_t j_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [36];
  uint local_6ec;
  SPIRType *pSStack_6e8;
  uint32_t i_3;
  SPIRType *matrix_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0 [36];
  uint32_t local_69c;
  uint32_t local_698;
  uint32_t num_control_points_3;
  uint32_t base_interface_index_1;
  char local_66a;
  allocator local_669;
  string local_668 [39];
  char local_641;
  undefined1 local_640 [7];
  bool is_array_of_matrix;
  undefined1 local_620 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  undefined1 local_5c0 [44];
  AccessChainMeta meta_4;
  uint32_t indices_4 [2];
  undefined1 local_568 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [32];
  undefined1 local_508 [44];
  AccessChainMeta meta_3;
  uint32_t indices_3 [2];
  uint32_t k_1;
  uint32_t array_size_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  undefined1 local_488 [32];
  undefined1 local_468 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  undefined1 local_408 [40];
  AccessChainMeta meta_2;
  uint32_t indices_2 [2];
  uint32_t k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [32];
  SPIRType *local_390;
  SPIRType *expr_mbr_type;
  SPIRType *mbr_type;
  string local_378 [36];
  uint local_354;
  string local_350 [4];
  uint32_t j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [36];
  uint local_30c;
  SPIRFunction *pSStack_308;
  uint32_t i_2;
  SPIRType *struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  uint32_t local_2c0;
  char local_2ba;
  allocator local_2b9;
  uint32_t num_control_points_2;
  byte local_291;
  undefined1 local_290 [7];
  bool is_array_of_struct;
  undefined1 local_26c [8];
  AccessChainMeta meta_1;
  uint32_t indices_1 [2];
  uint32_t j;
  uint32_t array_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [36];
  uint local_20c;
  SPIRType *pSStack_208;
  uint32_t i_1;
  SPIRType *sub_type;
  uint32_t base_interface_index;
  uint32_t num_control_points_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [38];
  char local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  char local_18a;
  allocator local_189;
  string local_188 [38];
  char local_162;
  allocator local_161;
  string local_160 [38];
  char local_13a;
  allocator local_139;
  string local_138 [32];
  undefined1 local_118 [44];
  AccessChainMeta meta;
  uint32_t indices [2];
  uint32_t i;
  uint32_t num_control_points;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [36];
  uint32_t local_94;
  SPIRType *local_90;
  SPIRType *iface_type;
  SPIRType *expr_type;
  SPIRVariable *var;
  undefined1 local_64;
  undefined1 uStack_63;
  undefined2 uStack_62;
  string local_60 [4];
  uint32_t interface_index;
  string expr;
  ID local_3c;
  bool flat_data_type;
  bool flattened_io;
  bool ptr_is_io_variable;
  __node_base _Stack_38;
  SPIRType *result_type;
  SPIRType *ptr_type;
  uint32_t local_20;
  uint32_t ptr_local;
  uint32_t id_local;
  uint32_t result_type_id_local;
  CompilerMSL *this_local;
  
  ptr_type._4_4_ = ptr;
  local_20 = id;
  ptr_local = result_type_id;
  _id_local = this;
  result_type = Compiler::expression_type((Compiler *)this,ptr);
  _Stack_38._M_nxt =
       (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,ptr_local);
  if ((result_type->storage != StorageClassInput) && (result_type->storage != StorageClassOutput)) {
    this_local._7_1_ = 0;
    goto LAB_004bba7d;
  }
  if ((result_type->storage == StorageClassOutput) && (bVar1 = is_tese_shader(this), bVar1)) {
    this_local._7_1_ = 0;
    goto LAB_004bba7d;
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,ptr_type._4_4_);
  bVar1 = Compiler::has_decoration((Compiler *)this,local_3c,DecorationPatch);
  if (bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004bba7d;
  }
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>,(ulong)ptr_type._4_4_);
  TVar4 = Variant::get_type(this_00);
  bVar13 = TVar4 == TypeVariable;
  bVar2 = variable_storage_requires_stage_io(this,result_type->storage);
  bVar1 = false;
  if (bVar2) {
    bVar3 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
    bVar1 = true;
    if (!bVar3) {
      bVar3 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
      bVar1 = true;
      if (!bVar3) {
        bVar1 = *(int *)((ID *)(_Stack_38._M_nxt + 1) + 1) == 0xf;
      }
    }
  }
  if ((bVar13) && (bVar3 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt), bVar3)
     ) {
    bVar1 = true;
  }
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004bba7d;
  }
  ::std::__cxx11::string::string(local_60);
  _local_64 = Compiler::get_extended_decoration
                        ((Compiler *)this,ptr_type._4_4_,SPIRVCrossDecorationInterfaceMemberIndex);
  expr_type = (SPIRType *)Compiler::maybe_get_backing_variable((Compiler *)this,ptr_type._4_4_);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(result_type->super_IVariant).self);
  iface_type = Compiler::get_pointee_type((Compiler *)this,uVar5);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
  local_90 = Compiler::expression_type((Compiler *)this,uVar5);
  uVar5 = (uint32_t)this;
  if (bVar2) {
    sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(_Stack_38._M_nxt + 4));
    if (2 < sVar9) {
      local_13a = '\x01';
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_138,"Cannot load tessellation IO variables with more than 2 dimensions.",
                 &local_139);
      CompilerError::CompilerError(pCVar10,(string *)local_138);
      local_13a = '\0';
      __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(_Stack_38._M_nxt + 4));
    if (sVar9 == 2) {
      if (!bVar13) {
        local_162 = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_160,
                   "Loading an array-of-array must be loaded directly from an IO variable.",
                   &local_161);
        CompilerError::CompilerError(pCVar10,(string *)local_160);
        local_162 = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (_local_64 == 0xffffffff) {
        local_18a = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_188,"Interface index is unknown. Cannot continue.",&local_189);
        CompilerError::CompilerError(pCVar10,(string *)local_188);
        local_18a = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((*(int *)((ID *)(_Stack_38._M_nxt + 1) + 1) == 0xf) ||
         (bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_38._M_nxt), bVar1)) {
        local_1b2 = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b0,"Cannot load array-of-array of composite type in tessellation IO.",
                   &local_1b1);
        CompilerError::CompilerError(pCVar10,(string *)local_1b0);
        local_1b2 = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&base_interface_index,this,_Stack_38._M_nxt,0);
      ::std::operator+(local_1d8,(char *)&base_interface_index);
      ::std::__cxx11::string::operator+=(local_60,(string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::string::~string((string *)&base_interface_index);
      sub_type._4_4_ =
           CompilerGLSL::to_array_size_literal
                     (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,1);
      sub_type._0_4_ = _local_64;
      uVar6 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((TypeID *)(_Stack_38._M_nxt + 0x22) + 1));
      pSStack_208 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      for (local_20c = 0; local_20c < sub_type._4_4_; local_20c = local_20c + 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&j,this,pSStack_208,0);
        ::std::operator+(local_230,(char *)&j);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_230);
        ::std::__cxx11::string::~string((string *)local_230);
        ::std::__cxx11::string::~string((string *)&j);
        _local_64 = (uint32_t)sub_type;
        uVar6 = CompilerGLSL::to_array_size_literal
                          (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,0);
        for (indices_1[0] = 0; indices_1[0] < uVar6; indices_1[0] = indices_1[0] + 1) {
          meta_1.need_transpose = (bool)(undefined1)local_20c;
          meta_1.storage_is_packed = (bool)local_20c._1_1_;
          meta_1.storage_is_invariant = (bool)local_20c._2_1_;
          meta_1.flattened_struct = (bool)local_20c._3_1_;
          meta_1.relaxed_precision = (bool)local_64;
          meta_1.access_meshlet_position_y = (bool)uStack_63;
          meta_1._10_2_ = uStack_62;
          AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_26c);
          uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    ((CompilerGLSL *)local_290,uVar5,(uint32_t *)(ulong)uVar7,(int)&meta_1 + 4,2,
                     (AccessChainMeta *)0x5);
          ::std::__cxx11::string::operator+=(local_60,(string *)local_290);
          ::std::__cxx11::string::~string((string *)local_290);
          bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_208);
          if (((!bVar1) && (*(int *)&(pSStack_208->super_IVariant).field_0xc != 0xf)) &&
             (pSStack_208->vecsize < iface_type->vecsize)) {
            pcVar11 = CompilerGLSL::vector_swizzle(pSStack_208->vecsize,0);
            ::std::__cxx11::string::operator+=(local_60,pcVar11);
          }
          if (indices_1[0] + 1 < uVar6) {
            ::std::__cxx11::string::operator+=(local_60,", ");
          }
          _local_64 = _local_64 + 1;
        }
        ::std::__cxx11::string::operator+=(local_60," })");
        if (local_20c + 1 < sub_type._4_4_) {
          ::std::__cxx11::string::operator+=(local_60,", ");
        }
      }
      ::std::__cxx11::string::operator+=(local_60," })");
    }
    else if (*(int *)((ID *)(_Stack_38._M_nxt + 1) + 1) == 0xf) {
      local_291 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
      if (((bool)local_291) && (!bVar13)) {
        local_2ba = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&num_control_points_2,
                   "Loading array of struct from IO variable must come directly from IO variable.",
                   &local_2b9);
        CompilerError::CompilerError(pCVar10,(string *)&num_control_points_2);
        local_2ba = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_2c0 = 1;
      if ((bool)local_291) {
        local_2c0 = CompilerGLSL::to_array_size_literal
                              (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&struct_type,this,_Stack_38._M_nxt,0);
        ::std::operator+(local_2e0,(char *)&struct_type);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_2e0);
        ::std::__cxx11::string::~string((string *)local_2e0);
        ::std::__cxx11::string::~string((string *)&struct_type);
      }
      if ((local_291 & 1) == 0) {
        local_ab8 = (SPIRFunction *)_Stack_38._M_nxt;
      }
      else {
        uVar6 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((TypeID *)(_Stack_38._M_nxt + 0x22) + 1));
        local_ab8 = (SPIRFunction *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      }
      pSStack_308 = local_ab8;
      bVar1 = VectorView<unsigned_int>::empty
                        ((VectorView<unsigned_int> *)
                         &(local_ab8->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size);
      if (!bVar1) {
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x1df7,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      for (local_30c = 0; local_30c < local_2c0; local_30c = local_30c + 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_350,this,pSStack_308,0);
        ::std::operator+(local_330,(char *)local_350);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_330);
        ::std::__cxx11::string::~string((string *)local_330);
        ::std::__cxx11::string::~string(local_350);
        for (local_354 = 0; uVar8 = local_354,
            sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               ((long)(pSStack_308->arguments).stack_storage.aligned_char + 0x58)),
            uVar8 < (uint)sVar9; local_354 = local_354 + 1) {
          if (expr_type != (SPIRType *)0x0) {
            uVar6 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(expr_type->super_IVariant).self);
            _local_64 = Compiler::get_extended_member_decoration
                                  ((Compiler *)this,uVar6,local_354,
                                   SPIRVCrossDecorationInterfaceMemberIndex);
          }
          if (_local_64 == 0xffffffff) {
            mbr_type._6_1_ = 1;
            pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_378,"Interface index is unknown. Cannot continue.",
                       (allocator *)((long)&mbr_type + 7));
            CompilerError::CompilerError(pCVar10,(string *)local_378);
            mbr_type._6_1_ = 0;
            __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pTVar12 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               ((long)(pSStack_308->arguments).stack_storage.aligned_char + 0x58),
                               (ulong)local_354);
          uVar6 = TypedID::operator_cast_to_unsigned_int(pTVar12);
          expr_mbr_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          pTVar12 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(iface_type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_354);
          uVar6 = TypedID::operator_cast_to_unsigned_int(pTVar12);
          local_390 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          bVar1 = Compiler::is_matrix((Compiler *)this,expr_mbr_type);
          if ((bVar1) && (result_type->storage == StorageClassInput)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices_2 + 1,this,expr_mbr_type,0);
            ::std::operator+(local_3b0,(char *)(indices_2 + 1));
            ::std::__cxx11::string::operator+=(local_60,(string *)local_3b0);
            ::std::__cxx11::string::~string((string *)local_3b0);
            ::std::__cxx11::string::~string((string *)(indices_2 + 1));
            for (indices_2[0] = 0; indices_2[0] < expr_mbr_type->columns;
                indices_2[0] = indices_2[0] + 1) {
              if ((local_291 & 1) == 0) {
                CompilerGLSL::to_expression_abi_cxx11_
                          ((CompilerGLSL *)local_468,uVar5,SUB41(ptr_type._4_4_,0));
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_468 + 0x20),local_468);
                CompilerGLSL::to_member_name_abi_cxx11_
                          ((CompilerGLSL *)local_488,(SPIRType *)this,(uint32_t)local_90);
                ::std::operator+(local_428,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_468 + 0x20));
                ::std::__cxx11::string::operator+=(local_60,(string *)local_428);
                ::std::__cxx11::string::~string((string *)local_428);
                ::std::__cxx11::string::~string((string *)local_488);
                ::std::__cxx11::string::~string((string *)(local_468 + 0x20));
                ::std::__cxx11::string::~string((string *)local_468);
              }
              else {
                meta_2.need_transpose = (bool)(undefined1)local_30c;
                meta_2.storage_is_packed = (bool)local_30c._1_1_;
                meta_2.storage_is_invariant = (bool)local_30c._2_1_;
                meta_2.flattened_struct = (bool)local_30c._3_1_;
                meta_2.relaxed_precision = (bool)local_64;
                meta_2.access_meshlet_position_y = (bool)uStack_63;
                meta_2._10_2_ = uStack_62;
                AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_408 + 0x20));
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&this->stage_in_ptr_var_id);
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          ((CompilerGLSL *)local_408,uVar5,(uint32_t *)(ulong)uVar6,(int)&meta_2 + 4
                           ,2,(AccessChainMeta *)0x5);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_408);
                ::std::__cxx11::string::~string((string *)local_408);
              }
              if (expr_mbr_type->vecsize < local_390->vecsize) {
                pcVar11 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                ::std::__cxx11::string::operator+=(local_60,pcVar11);
              }
              if (indices_2[0] + 1 < expr_mbr_type->columns) {
                ::std::__cxx11::string::operator+=(local_60,", ");
              }
              _local_64 = _local_64 + 1;
            }
            ::std::__cxx11::string::operator+=(local_60,")");
          }
          else {
            bVar1 = Compiler::is_array((Compiler *)this,expr_mbr_type);
            if (bVar1) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&k_1,this,expr_mbr_type,0);
              ::std::operator+(local_4a8,(char *)&k_1);
              ::std::__cxx11::string::operator+=(local_60,(string *)local_4a8);
              ::std::__cxx11::string::~string((string *)local_4a8);
              ::std::__cxx11::string::~string((string *)&k_1);
              uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,expr_mbr_type,0)
              ;
              for (indices_3[0] = 0; indices_3[0] < uVar6; indices_3[0] = indices_3[0] + 1) {
                if ((local_291 & 1) == 0) {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((CompilerGLSL *)local_568,uVar5,SUB41(ptr_type._4_4_,0));
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_568 + 0x20),local_568);
                  CompilerGLSL::to_member_name_abi_cxx11_
                            ((CompilerGLSL *)indices_4,(SPIRType *)this,(uint32_t)local_90);
                  ::std::operator+(local_528,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_568 + 0x20));
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_528);
                  ::std::__cxx11::string::~string((string *)local_528);
                  ::std::__cxx11::string::~string((string *)indices_4);
                  ::std::__cxx11::string::~string((string *)(local_568 + 0x20));
                  ::std::__cxx11::string::~string((string *)local_568);
                }
                else {
                  meta_3.need_transpose = (bool)(undefined1)local_30c;
                  meta_3.storage_is_packed = (bool)local_30c._1_1_;
                  meta_3.storage_is_invariant = (bool)local_30c._2_1_;
                  meta_3.flattened_struct = (bool)local_30c._3_1_;
                  meta_3.relaxed_precision = (bool)local_64;
                  meta_3.access_meshlet_position_y = (bool)uStack_63;
                  meta_3._10_2_ = uStack_62;
                  AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_508 + 0x24));
                  uVar7 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&this->stage_in_ptr_var_id);
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            ((CompilerGLSL *)local_508,uVar5,(uint32_t *)(ulong)uVar7,
                             (int)&meta_3 + 4,2,(AccessChainMeta *)0x5);
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_508);
                  ::std::__cxx11::string::~string((string *)local_508);
                }
                if (expr_mbr_type->vecsize < local_390->vecsize) {
                  pcVar11 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                  ::std::__cxx11::string::operator+=(local_60,pcVar11);
                }
                if (indices_3[0] + 1 < uVar6) {
                  ::std::__cxx11::string::operator+=(local_60,", ");
                }
                _local_64 = _local_64 + 1;
              }
              ::std::__cxx11::string::operator+=(local_60," })");
            }
            else {
              if ((local_291 & 1) == 0) {
                CompilerGLSL::to_expression_abi_cxx11_
                          ((CompilerGLSL *)local_620,uVar5,SUB41(ptr_type._4_4_,0));
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_620 + 0x20),local_620);
                CompilerGLSL::to_member_name_abi_cxx11_
                          ((CompilerGLSL *)local_640,(SPIRType *)this,(uint32_t)local_90);
                ::std::operator+(local_5e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_620 + 0x20));
                ::std::__cxx11::string::operator+=(local_60,(string *)local_5e0);
                ::std::__cxx11::string::~string((string *)local_5e0);
                ::std::__cxx11::string::~string((string *)local_640);
                ::std::__cxx11::string::~string((string *)(local_620 + 0x20));
                ::std::__cxx11::string::~string((string *)local_620);
              }
              else {
                meta_4.need_transpose = (bool)(undefined1)local_30c;
                meta_4.storage_is_packed = (bool)local_30c._1_1_;
                meta_4.storage_is_invariant = (bool)local_30c._2_1_;
                meta_4.flattened_struct = (bool)local_30c._3_1_;
                meta_4.relaxed_precision = (bool)local_64;
                meta_4.access_meshlet_position_y = (bool)uStack_63;
                meta_4._10_2_ = uStack_62;
                AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_5c0 + 0x24));
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&this->stage_in_ptr_var_id);
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          ((CompilerGLSL *)local_5c0,uVar5,(uint32_t *)(ulong)uVar6,(int)&meta_4 + 4
                           ,2,(AccessChainMeta *)0x5);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_5c0);
                ::std::__cxx11::string::~string((string *)local_5c0);
              }
              if (expr_mbr_type->vecsize < local_390->vecsize) {
                pcVar11 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                ::std::__cxx11::string::operator+=(local_60,pcVar11);
              }
            }
          }
          uVar8 = local_354 + 1;
          sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             ((long)(pSStack_308->arguments).stack_storage.aligned_char + 0x58));
          if (uVar8 < sVar9) {
            ::std::__cxx11::string::operator+=(local_60,", ");
          }
        }
        ::std::__cxx11::string::operator+=(local_60," }");
        if (local_30c + 1 < local_2c0) {
          ::std::__cxx11::string::operator+=(local_60,", ");
        }
      }
      if ((local_291 & 1) != 0) {
        ::std::__cxx11::string::operator+=(local_60," })");
      }
    }
    else {
      bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
      if (bVar1) {
        local_641 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
        if (((bool)local_641) && (!bVar13)) {
          local_66a = '\x01';
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_668,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                     ,&local_669);
          CompilerError::CompilerError(pCVar10,(string *)local_668);
          local_66a = '\0';
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (_local_64 == 0xffffffff) {
          num_control_points_3._2_1_ = 1;
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&base_interface_index_1,
                     "Interface index is unknown. Cannot continue.",
                     (allocator *)((long)&num_control_points_3 + 3));
          CompilerError::CompilerError(pCVar10,(string *)&base_interface_index_1);
          num_control_points_3._2_1_ = 0;
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((bool)local_641) {
          local_698 = _local_64;
          local_69c = CompilerGLSL::to_array_size_literal
                                (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&matrix_type,this,_Stack_38._M_nxt,0);
          ::std::operator+(local_6c0,(char *)&matrix_type);
          ::std::__cxx11::string::operator+=(local_60,(string *)local_6c0);
          ::std::__cxx11::string::~string((string *)local_6c0);
          ::std::__cxx11::string::~string((string *)&matrix_type);
          var_00 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ptr_type._4_4_);
          pSStack_6e8 = Compiler::get_variable_element_type((Compiler *)this,var_00);
          for (local_6ec = 0; local_6ec < local_69c; local_6ec = local_6ec + 1) {
            _local_64 = local_698;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices_5 + 1,this,pSStack_6e8,0);
            ::std::operator+(local_710,(char *)(indices_5 + 1));
            ::std::__cxx11::string::operator+=(local_60,(string *)local_710);
            ::std::__cxx11::string::~string((string *)local_710);
            ::std::__cxx11::string::~string((string *)(indices_5 + 1));
            for (indices_5[0] = 0;
                indices_5[0] <
                *(uint *)&(((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                           (_Stack_38._M_nxt + 3))->
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
                indices_5[0] = indices_5[0] + 1) {
              meta_5.need_transpose = (bool)(undefined1)local_6ec;
              meta_5.storage_is_packed = (bool)local_6ec._1_1_;
              meta_5.storage_is_invariant = (bool)local_6ec._2_1_;
              meta_5.flattened_struct = (bool)local_6ec._3_1_;
              meta_5.relaxed_precision = (bool)local_64;
              meta_5.access_meshlet_position_y = (bool)uStack_63;
              meta_5._10_2_ = uStack_62;
              AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_768 + 0x20));
              uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        ((CompilerGLSL *)local_768,uVar5,(uint32_t *)(ulong)uVar6,(int)&meta_5 + 4,2
                         ,(AccessChainMeta *)0x5);
              ::std::__cxx11::string::operator+=(local_60,(string *)local_768);
              ::std::__cxx11::string::~string((string *)local_768);
              if (((TypeID *)(_Stack_38._M_nxt + 2))[1].id < iface_type->vecsize) {
                pcVar11 = CompilerGLSL::vector_swizzle(((TypeID *)(_Stack_38._M_nxt + 2))[1].id,0);
                ::std::__cxx11::string::operator+=(local_60,pcVar11);
              }
              if (indices_5[0] + 1 <
                  *(uint *)&(((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                             (_Stack_38._M_nxt + 3))->
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr) {
                ::std::__cxx11::string::operator+=(local_60,", ");
              }
              _local_64 = _local_64 + 1;
            }
            ::std::__cxx11::string::operator+=(local_60,")");
            if (local_6ec + 1 < local_69c) {
              ::std::__cxx11::string::operator+=(local_60,", ");
            }
          }
          ::std::__cxx11::string::operator+=(local_60," })");
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_7a8,this,_Stack_38._M_nxt,0);
          ::std::operator+(local_788,(char *)local_7a8);
          ::std::__cxx11::string::operator+=(local_60,(string *)local_788);
          ::std::__cxx11::string::~string((string *)local_788);
          ::std::__cxx11::string::~string(local_7a8);
          for (local_7ac = 0;
              local_7ac <
              *(uint *)&(((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                         (_Stack_38._M_nxt + 3))->
                        super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
              local_7ac = local_7ac + 1) {
            CompilerGLSL::to_expression_abi_cxx11_
                      ((CompilerGLSL *)local_810,uVar5,SUB41(ptr_type._4_4_,0));
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_810 + 0x20),local_810);
            CompilerGLSL::to_member_name_abi_cxx11_
                      ((CompilerGLSL *)local_830,(SPIRType *)this,(uint32_t)local_90);
            ::std::operator+(local_7d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_810 + 0x20));
            ::std::__cxx11::string::operator+=(local_60,(string *)local_7d0);
            ::std::__cxx11::string::~string((string *)local_7d0);
            ::std::__cxx11::string::~string((string *)local_830);
            ::std::__cxx11::string::~string((string *)(local_810 + 0x20));
            ::std::__cxx11::string::~string((string *)local_810);
            if (((TypeID *)(_Stack_38._M_nxt + 2))[1].id < iface_type->vecsize) {
              pcVar11 = CompilerGLSL::vector_swizzle(((TypeID *)(_Stack_38._M_nxt + 2))[1].id,0);
              ::std::__cxx11::string::operator+=(local_60,pcVar11);
            }
            if (local_7ac + 1 <
                *(uint *)&(((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                           (_Stack_38._M_nxt + 3))->
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr) {
              ::std::__cxx11::string::operator+=(local_60,", ");
            }
            _local_64 = _local_64 + 1;
          }
          ::std::__cxx11::string::operator+=(local_60,")");
        }
      }
      else if (bVar13) {
        bVar1 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
        if (!bVar1) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1e8b,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(_Stack_38._M_nxt + 4));
        if (sVar9 != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1e8c,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (_local_64 == 0xffffffff) {
          local_852 = '\x01';
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_850,"Interface index is unknown. Cannot continue.",&local_851);
          CompilerError::CompilerError(pCVar10,(string *)local_850);
          local_852 = '\0';
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&i_5,this,_Stack_38._M_nxt,0);
        ::std::operator+(local_878,(char *)&i_5);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_878);
        ::std::__cxx11::string::~string((string *)local_878);
        ::std::__cxx11::string::~string((string *)&i_5);
        uVar6 = CompilerGLSL::to_array_size_literal
                          (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,0);
        for (indices_6[0] = 0; indices_6[0] < uVar6; indices_6[0] = indices_6[0] + 1) {
          meta_6.need_transpose = (bool)(undefined1)indices_6[0];
          meta_6.storage_is_packed = (bool)indices_6[0]._1_1_;
          meta_6.storage_is_invariant = (bool)indices_6[0]._2_1_;
          meta_6.flattened_struct = (bool)indices_6[0]._3_1_;
          meta_6.relaxed_precision = (bool)local_64;
          meta_6.access_meshlet_position_y = (bool)uStack_63;
          meta_6._10_2_ = uStack_62;
          AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_8d8 + 0x24));
          uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    ((CompilerGLSL *)local_8d8,uVar5,(uint32_t *)(ulong)uVar7,(int)&meta_6 + 4,2,
                     (AccessChainMeta *)0x5);
          ::std::__cxx11::string::operator+=(local_60,(string *)local_8d8);
          ::std::__cxx11::string::~string((string *)local_8d8);
          if (((TypeID *)(_Stack_38._M_nxt + 2))[1].id < iface_type->vecsize) {
            pcVar11 = CompilerGLSL::vector_swizzle(((TypeID *)(_Stack_38._M_nxt + 2))[1].id,0);
            ::std::__cxx11::string::operator+=(local_60,pcVar11);
          }
          if (indices_6[0] + 1 < uVar6) {
            ::std::__cxx11::string::operator+=(local_60,", ");
          }
        }
        ::std::__cxx11::string::operator+=(local_60," })");
      }
      else {
        bVar1 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_38._M_nxt);
        if (!bVar1) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1ea7,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(_Stack_38._M_nxt + 4));
        if (sVar9 != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1ea8,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (_local_64 == 0xffffffff) {
          local_8fa = '\x01';
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_8f8,"Interface index is unknown. Cannot continue.",&local_8f9);
          CompilerError::CompilerError(pCVar10,(string *)local_8f8);
          local_8fa = '\0';
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&i_6,this,_Stack_38._M_nxt,0);
        ::std::operator+(local_920,(char *)&i_6);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_920);
        ::std::__cxx11::string::~string((string *)local_920);
        ::std::__cxx11::string::~string((string *)&i_6);
        local_944 = CompilerGLSL::to_array_size_literal
                              (&this->super_CompilerGLSL,(SPIRType *)_Stack_38._M_nxt,0);
        for (local_948 = 0; local_948 < local_944; local_948 = local_948 + 1) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_9a8,uVar5,SUB41(ptr_type._4_4_,0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_9a8 + 0x20),local_9a8);
          CompilerGLSL::to_member_name_abi_cxx11_
                    ((CompilerGLSL *)local_9c8,(SPIRType *)this,(uint32_t)local_90);
          ::std::operator+(local_968,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_9a8 + 0x20));
          ::std::__cxx11::string::operator+=(local_60,(string *)local_968);
          ::std::__cxx11::string::~string((string *)local_968);
          ::std::__cxx11::string::~string((string *)local_9c8);
          ::std::__cxx11::string::~string((string *)(local_9a8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_9a8);
          if (((TypeID *)(_Stack_38._M_nxt + 2))[1].id < iface_type->vecsize) {
            pcVar11 = CompilerGLSL::vector_swizzle(((TypeID *)(_Stack_38._M_nxt + 2))[1].id,0);
            ::std::__cxx11::string::operator+=(local_60,pcVar11);
          }
          if (local_948 + 1 < local_944) {
            ::std::__cxx11::string::operator+=(local_60,", ");
          }
          _local_64 = _local_64 + 1;
        }
        ::std::__cxx11::string::operator+=(local_60," })");
      }
    }
LAB_004bba25:
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,ptr_local,local_20,(string *)local_60,false,false);
    Compiler::register_read((Compiler *)this,local_20,ptr_type._4_4_,false);
    this_local._7_1_ = 1;
  }
  else {
    if (_local_64 != 0xffffffff) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&i,this,_Stack_38._M_nxt,0);
      ::std::operator+(local_b8,(char *)&i);
      ::std::__cxx11::string::operator+=(local_60,(string *)local_b8);
      ::std::__cxx11::string::~string((string *)local_b8);
      ::std::__cxx11::string::~string((string *)&i);
      type._M_nxt = _Stack_38._M_nxt;
      sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(_Stack_38._M_nxt + 4));
      uVar6 = CompilerGLSL::to_array_size_literal
                        (&this->super_CompilerGLSL,(SPIRType *)type._M_nxt,(int)sVar9 - 1);
      for (indices[0] = 0; indices[0] < uVar6; indices[0] = indices[0] + 1) {
        meta.need_transpose = (bool)(undefined1)indices[0];
        meta.storage_is_packed = (bool)indices[0]._1_1_;
        meta.storage_is_invariant = (bool)indices[0]._2_1_;
        meta.flattened_struct = (bool)indices[0]._3_1_;
        meta.relaxed_precision = (bool)local_64;
        meta.access_meshlet_position_y = (bool)uStack_63;
        meta._10_2_ = uStack_62;
        AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_118 + 0x24));
        uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  ((CompilerGLSL *)local_118,uVar5,(uint32_t *)(ulong)uVar7,(int)&meta + 4,2,
                   (AccessChainMeta *)0x5);
        ::std::__cxx11::string::operator+=(local_60,(string *)local_118);
        ::std::__cxx11::string::~string((string *)local_118);
        if (indices[0] + 1 < uVar6) {
          ::std::__cxx11::string::operator+=(local_60,", ");
        }
      }
      ::std::__cxx11::string::operator+=(local_60," })");
      goto LAB_004bba25;
    }
    this_local._7_1_ = 0;
  }
  local_94 = 1;
  ::std::__cxx11::string::~string(local_60);
LAB_004bba7d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}